

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_samplers(Impl *this,MDNode *samplers,MDNode *refl)

{
  ResourceRemappingInterface *pRVar1;
  pointer pRVar2;
  ResourceVariableMeta RVar3;
  uint uVar4;
  uint uVar5;
  uint space;
  uint binding;
  uint u;
  uint uVar6;
  int iVar7;
  Id IVar8;
  Id sizeId;
  Builder *this_00;
  MDOperand *md;
  MDNode *resource;
  LoggingCallback p_Var9;
  void *pvVar10;
  pointer in_RCX;
  _Alloc_hider name_00;
  ulong __new_size;
  char *__ptr;
  uint index;
  bool bVar11;
  size_t sStack_1130;
  uint local_10f8;
  uint uStack_10f4;
  undefined8 local_10f0;
  char local_10e8;
  undefined4 local_10e4;
  Vector<ResourceReference> *local_10e0;
  D3DBinding d3d_binding;
  DescriptorTableEntry local_table_entry;
  BindlessInfo local_1088;
  String name;
  char buffer [4096];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  uVar4 = LLVMBC::MDNode::getNumOperands(samplers);
  local_10e0 = &this->sampler_index_to_reference;
  index = 0;
  do {
    if (uVar4 == index) {
LAB_00112ecb:
      return uVar4 <= index;
    }
    md = LLVMBC::MDNode::getOperand(samplers,index);
    resource = LLVMBC::cast<LLVMBC::MDNode>(md);
    RVar3 = get_resource_variable_meta(this,resource);
    if (0xff < (ushort)RVar3) {
      uVar5 = get_constant_metadata<unsigned_int>(resource,0);
      get_resource_name_metadata_abi_cxx11_(&name,(dxil_spv *)resource,refl,(MDNode *)in_RCX);
      space = get_constant_metadata<unsigned_int>(resource,3);
      binding = get_constant_metadata<unsigned_int>(resource,4);
      u = get_constant_metadata<unsigned_int>(resource,5);
      if (u != 1) {
        if (u == 0xffffffff) {
          spv::Builder::addExtension(this_00,"SPV_EXT_descriptor_indexing");
          spv::Builder::addCapability(this_00,CapabilityRuntimeDescriptorArray);
        }
        spv::Builder::addCapability(this_00,CapabilitySampledImageArrayDynamicIndexing);
      }
      local_table_entry.type = SRV;
      local_table_entry.register_space = 0;
      local_table_entry.register_index = 0;
      local_table_entry.num_descriptors_in_range = 0;
      local_table_entry.offset_in_heap = 0;
      uVar6 = get_local_root_signature_entry(this,Sampler,space,binding,&local_table_entry);
      if ((int)uVar6 < 0) {
        bVar11 = true;
      }
      else {
        bVar11 = (this->local_root_signature).
                 super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].type == Table;
      }
      d3d_binding.stage = get_remapping_stage(this->execution_model);
      d3d_binding.kind = Sampler;
      d3d_binding.alignment = 0;
      local_10e4 = 0;
      local_10e8 = '\0';
      local_10f0 = 0;
      local_10f8 = space;
      uStack_10f4 = binding;
      d3d_binding.resource_index = uVar5;
      d3d_binding.register_space = space;
      d3d_binding.register_index = binding;
      d3d_binding.range_size = u;
      if (((bVar11) &&
          (pRVar1 = this->resource_mapping_iface, pRVar1 != (ResourceRemappingInterface *)0x0)) &&
         (iVar7 = (*pRVar1->_vptr_ResourceRemappingInterface[3])(pRVar1,&d3d_binding,&local_10f8),
         (char)iVar7 == '\0')) {
        p_Var9 = get_thread_log_callback();
        if (p_Var9 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Failed to remap sampler %u:%u.\n",(ulong)space,(ulong)binding);
          fflush(_stderr);
        }
        else {
          snprintf(buffer,0x1000,"Failed to remap sampler %u:%u.\n",(ulong)space,(ulong)binding);
          pvVar10 = get_thread_log_callback_userdata();
          (*p_Var9)(pvVar10,Error,buffer);
        }
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        _M_dispose(&name);
        goto LAB_00112ecb;
      }
      __new_size = (long)(this->sampler_index_to_reference).
                         super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->sampler_index_to_reference).
                         super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 6;
      if (__new_size <= uVar5 + 1) {
        __new_size = (ulong)(uVar5 + 1);
      }
      std::
      vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
      ::resize(local_10e0,__new_size);
      local_1088.format = ImageFormatUnknown;
      local_1088.descriptor_type = Identity;
      local_1088.uav_read = false;
      local_1088.uav_written = false;
      local_1088.uav_coherent = false;
      local_1088.counters = false;
      local_1088.offsets = false;
      local_1088.aliased = false;
      local_1088.relaxed_precision = false;
      local_1088._27_1_ = 0;
      local_1088.type = Sampler;
      local_1088.component = Invalid;
      local_1088._2_2_ = 0;
      local_1088.raw_vecsize = V1;
      local_1088.kind = Sampler;
      local_1088._9_3_ = 0;
      local_1088.binding = uStack_10f4;
      local_1088.desc_set = local_10f8;
      if (-1 < (int)uVar6) {
        if (local_10e8 == '\0') {
          p_Var9 = get_thread_log_callback();
          if (p_Var9 != (LoggingCallback)0x0) {
            builtin_strncpy(buffer,"Table SBT entries must be bindless.\n",0x25);
            goto LAB_00112e52;
          }
          __ptr = "[ERROR]: Table SBT entries must be bindless.\n";
          sStack_1130 = 0x2d;
LAB_00112f0b:
          fwrite(__ptr,sStack_1130,1,_stderr);
          fflush(_stderr);
        }
        else {
          IVar8 = create_bindless_heap_variable(this,&local_1088);
          if (((ushort)RVar3 & 1) != 0) {
            pRVar2 = (local_10e0->
                     super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            in_RCX = pRVar2 + uVar5;
            pRVar2[uVar5].var_id = IVar8;
            pRVar2[uVar5].base_offset =
                 (local_table_entry.offset_in_heap + binding) - local_table_entry.register_index;
            pRVar2[uVar5].bindless = true;
            pRVar2[uVar5].local_root_signature_entry = uVar6;
            goto LAB_00112d9f;
          }
          p_Var9 = get_thread_log_callback();
          if (p_Var9 == (LoggingCallback)0x0) {
            __ptr = "[ERROR]: Local root signature requires global lib variables.\n";
            sStack_1130 = 0x3d;
            goto LAB_00112f0b;
          }
          builtin_strncpy(buffer,"Local root signature requires global lib variables.\n",0x35);
LAB_00112e52:
          pvVar10 = get_thread_log_callback_userdata();
          (*p_Var9)(pvVar10,Error,buffer);
        }
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        _M_dispose(&name);
        goto LAB_00112ecb;
      }
      if (local_10e8 == '\0') {
        IVar8 = spv::Builder::makeSamplerType(this_00);
        if (u != 1) {
          if (u == 0xffffffff) {
            IVar8 = spv::Builder::makeRuntimeArray(this_00,IVar8);
          }
          else {
            sizeId = spv::Builder::makeUintConstant(this_00,u,false);
            IVar8 = spv::Builder::makeArrayType(this_00,IVar8,sizeId,0);
          }
        }
        name_00._M_p = (pointer)name._M_string_length;
        if (name._M_string_length != 0) {
          name_00._M_p = name._M_dataplus._M_p;
        }
        IVar8 = create_variable(this,StorageClassUniformConstant,IVar8,name_00._M_p);
        spv::Builder::addDecoration(this_00,IVar8,DecorationDescriptorSet,local_10f8);
        spv::Builder::addDecoration(this_00,IVar8,DecorationBinding,uStack_10f4);
        pRVar2 = (this->sampler_index_to_reference).
                 super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        in_RCX = pRVar2 + uVar5;
        pRVar2[uVar5].var_id = IVar8;
      }
      else {
        IVar8 = create_bindless_heap_variable(this,&local_1088);
        if (((ushort)RVar3 & 1) != 0) {
          binding = 0;
        }
        if (u == 1) {
          binding = 0;
        }
        pRVar2 = (this->sampler_index_to_reference).
                 super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pRVar2[uVar5].var_id = IVar8;
        in_RCX = pRVar2 + uVar5;
        pRVar2[uVar5].push_constant_member = this->root_descriptor_count + (int)local_10f0;
        pRVar2[uVar5].base_offset = local_10f0._4_4_ - binding;
        pRVar2[uVar5].bindless = true;
      }
LAB_00112d9f:
      in_RCX->base_resource_is_array = u != 1;
      in_RCX->resource_kind = Sampler;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&name);
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool Converter::Impl::emit_samplers(const llvm::MDNode *samplers, const llvm::MDNode *refl)
{
	auto &builder = spirv_module.get_builder();
	unsigned num_samplers = samplers->getNumOperands();

	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));

		auto var_meta = get_resource_variable_meta(sampler);
		if (!var_meta.is_active)
			continue;

		unsigned index = get_constant_metadata(sampler, 0);
		auto name = get_resource_name_metadata(sampler, refl);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		if (range_size != 1)
		{
			if (range_size == ~0u)
			{
				builder.addExtension("SPV_EXT_descriptor_indexing");
				builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
			}

			// This capability also covers samplers.
			builder.addCapability(spv::CapabilitySampledImageArrayDynamicIndexing);
		}

		DescriptorTableEntry local_table_entry = {};
		int local_root_signature_entry = get_local_root_signature_entry(
			ResourceClass::Sampler, bind_space, bind_register, local_table_entry);
		bool need_resource_remapping = local_root_signature_entry < 0 ||
		                               local_root_signature[local_root_signature_entry].type == LocalRootSignatureType::Table;

		D3DBinding d3d_binding = { get_remapping_stage(execution_model),
			                       DXIL::ResourceKind::Sampler,
			                       index,
			                       bind_space,
			                       bind_register,
			                       range_size, 0 };
		VulkanBinding vulkan_binding = { bind_space, bind_register };
		if (need_resource_remapping && resource_mapping_iface && !resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding))
		{
			LOGE("Failed to remap sampler %u:%u.\n", bind_space, bind_register);
			return false;
		}

		sampler_index_to_reference.resize(std::max(sampler_index_to_reference.size(), size_t(index + 1)));

		BindlessInfo bindless_info = {};
		bindless_info.type = DXIL::ResourceType::Sampler;
		bindless_info.kind = DXIL::ResourceKind::Sampler;
		bindless_info.desc_set = vulkan_binding.descriptor_set;
		bindless_info.binding = vulkan_binding.binding;

		if (local_root_signature_entry >= 0)
		{
			// Samplers can only live in table entries.
			if (!vulkan_binding.bindless.use_heap)
			{
				LOGE("Table SBT entries must be bindless.\n");
				return false;
			}

			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			uint32_t heap_offset = local_table_entry.offset_in_heap;
			heap_offset += bind_register - local_table_entry.register_index;

			if (!var_meta.is_lib_variable)
			{
				LOGE("Local root signature requires global lib variables.\n");
				return false;
			}

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.local_root_signature_entry = local_root_signature_entry;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else if (vulkan_binding.bindless.use_heap)
		{
			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			// DXIL already applies the t# register offset to any dynamic index, so counteract that here.
			// The exception is with lib_* where we access resources by variable, not through
			// createResource() >_____<.
			uint32_t heap_offset = vulkan_binding.bindless.heap_root_offset;
			if (range_size != 1 && !var_meta.is_lib_variable)
				heap_offset -= bind_register;

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.push_constant_member = vulkan_binding.root_constant_index + root_descriptor_count;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else
		{
			spv::Id type_id = builder.makeSamplerType();

			if (range_size != 1)
			{
				if (range_size == ~0u)
					type_id = builder.makeRuntimeArray(type_id);
				else
					type_id = builder.makeArrayType(type_id, builder.makeUintConstant(range_size), 0);
			}

			spv::Id var_id = create_variable(spv::StorageClassUniformConstant, type_id, name.empty() ? nullptr : name.c_str());

			builder.addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.descriptor_set);
			builder.addDecoration(var_id, spv::DecorationBinding, vulkan_binding.binding);

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
	}

	return true;
}